

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_avx2.cpp
# Opt level: O1

int __thiscall
ncnn::HardSigmoid_x86_avx2::forward_inplace
          (HardSigmoid_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  undefined1 (*pauVar8) [16];
  uint uVar9;
  undefined1 (*pauVar10) [32];
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined4 uVar20;
  undefined1 auVar21 [32];
  
  uVar9 = bottom_top_blob->c;
  uVar5 = (ulong)uVar9;
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  if (bottom_top_blob->elempack == 8) {
    if (0 < (int)uVar9) {
      pp_Var2 = this->_vptr_HardSigmoid_x86_avx2;
      uVar7 = 0;
      auVar13._8_4_ = 0x3f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._12_4_ = 0x3f800000;
      auVar13._16_4_ = 0x3f800000;
      auVar13._20_4_ = 0x3f800000;
      auVar13._24_4_ = 0x3f800000;
      auVar13._28_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar4) {
          pauVar10 = (undefined1 (*) [32])
                     (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          uVar9 = uVar4;
          do {
            uVar20 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var2[-3]);
            auVar16._4_4_ = uVar20;
            auVar16._0_4_ = uVar20;
            auVar16._8_4_ = uVar20;
            auVar16._12_4_ = uVar20;
            auVar16._16_4_ = uVar20;
            auVar16._20_4_ = uVar20;
            auVar16._24_4_ = uVar20;
            auVar16._28_4_ = uVar20;
            uVar20 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            auVar18._4_4_ = uVar20;
            auVar18._0_4_ = uVar20;
            auVar18._8_4_ = uVar20;
            auVar18._12_4_ = uVar20;
            auVar18._16_4_ = uVar20;
            auVar18._20_4_ = uVar20;
            auVar18._24_4_ = uVar20;
            auVar18._28_4_ = uVar20;
            auVar12 = vfmadd132ps_fma(auVar18,auVar16,*pauVar10);
            auVar16 = vmaxps_avx(ZEXT1632(auVar12),ZEXT832(0));
            auVar16 = vminps_avx(auVar16,auVar13);
            *pauVar10 = auVar16;
            pauVar10 = pauVar10 + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
    }
  }
  else if (bottom_top_blob->elempack == 4) {
    if (0 < (int)uVar9) {
      pp_Var2 = this->_vptr_HardSigmoid_x86_avx2;
      uVar7 = 0;
      auVar12._8_4_ = 0x3f800000;
      auVar12._0_8_ = 0x3f8000003f800000;
      auVar12._12_4_ = 0x3f800000;
      do {
        if (0 < (int)uVar4) {
          pauVar8 = (undefined1 (*) [16])
                    (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                    (long)bottom_top_blob->data);
          uVar9 = uVar4;
          do {
            uVar20 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var2[-3]);
            auVar15._4_4_ = uVar20;
            auVar15._0_4_ = uVar20;
            auVar15._8_4_ = uVar20;
            auVar15._12_4_ = uVar20;
            uVar20 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var2[-3]);
            auVar17._4_4_ = uVar20;
            auVar17._0_4_ = uVar20;
            auVar17._8_4_ = uVar20;
            auVar17._12_4_ = uVar20;
            auVar15 = vfmadd132ps_fma(auVar17,auVar15,*pauVar8);
            auVar15 = vmaxps_avx(auVar15,ZEXT816(0));
            auVar15 = vminps_avx(auVar15,auVar12);
            *pauVar8 = auVar15;
            pauVar8 = pauVar8 + 1;
            uVar9 = uVar9 - 1;
          } while (uVar9 != 0);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 != uVar5);
    }
  }
  else if (0 < (int)uVar9) {
    pp_Var2 = this->_vptr_HardSigmoid_x86_avx2;
    uVar7 = 0;
    auVar14._8_4_ = 0x3f800000;
    auVar14._0_8_ = 0x3f8000003f800000;
    auVar14._12_4_ = 0x3f800000;
    auVar14._16_4_ = 0x3f800000;
    auVar14._20_4_ = 0x3f800000;
    auVar14._24_4_ = 0x3f800000;
    auVar14._28_4_ = 0x3f800000;
    do {
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * uVar7 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      if ((int)uVar4 < 8) {
        uVar9 = 0;
      }
      else {
        iVar11 = 7;
        do {
          p_Var3 = pp_Var2[-3];
          uVar20 = *(undefined4 *)(&this->field_0xd4 + (long)p_Var3);
          auVar19._4_4_ = uVar20;
          auVar19._0_4_ = uVar20;
          auVar19._8_4_ = uVar20;
          auVar19._12_4_ = uVar20;
          auVar19._16_4_ = uVar20;
          auVar19._20_4_ = uVar20;
          auVar19._24_4_ = uVar20;
          auVar19._28_4_ = uVar20;
          uVar20 = *(undefined4 *)(&this->field_0xd0 + (long)p_Var3);
          auVar21._4_4_ = uVar20;
          auVar21._0_4_ = uVar20;
          auVar21._8_4_ = uVar20;
          auVar21._12_4_ = uVar20;
          auVar21._16_4_ = uVar20;
          auVar21._20_4_ = uVar20;
          auVar21._24_4_ = uVar20;
          auVar21._28_4_ = uVar20;
          auVar12 = vfmadd132ps_fma(auVar21,auVar19,*pauVar10);
          auVar13 = vmaxps_avx(ZEXT1632(auVar12),ZEXT832(0));
          auVar13 = vminps_avx(auVar13,auVar14);
          *pauVar10 = auVar13;
          pauVar10 = pauVar10 + 1;
          iVar11 = iVar11 + 8;
          uVar9 = uVar4 & 0xfffffff8;
        } while (iVar11 < (int)uVar4);
      }
      if (uVar4 - uVar9 != 0 && (int)uVar9 <= (int)uVar4) {
        lVar6 = 0;
        do {
          fVar1 = *(float *)(*pauVar10 + lVar6 * 4);
          p_Var3 = pp_Var2[-3];
          uVar20 = 0;
          if ((*(float *)(&this->field_0xd8 + (long)p_Var3) <= fVar1) &&
             (uVar20 = 0x3f800000, fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var3))) {
            auVar12 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                      ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var3)),
                                      ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var3)));
            uVar20 = auVar12._0_4_;
          }
          *(undefined4 *)(*pauVar10 + lVar6 * 4) = uVar20;
          lVar6 = lVar6 + 1;
        } while (uVar4 - uVar9 != (int)lVar6);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar5);
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m256 _zero = _mm256_set1_ps(0.f);
            __m256 _one = _mm256_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _ans = _mm256_set1_ps(beta);
                _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
                _ans = _mm256_max_ps(_ans, _zero);
                _ans = _mm256_min_ps(_ans, _one);
                _mm256_storeu_ps(ptr, _ans);

                ptr += 8;
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            __m128 _zero = _mm_set1_ps(0.f);
            __m128 _one = _mm_set1_ps(1.f);
            for (int i = 0; i < size; i++)
            {
                __m128 _p = _mm_loadu_ps(ptr);
                __m128 _ans = _mm_set1_ps(beta);
                _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
                _ans = _mm_max_ps(_ans, _zero);
                _ans = _mm_min_ps(_ans, _one);
                _mm_storeu_ps(ptr, _ans);

                ptr += 4;
            }
        }

        return 0;
    }
#endif // __SSE2__

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __AVX__
        __m256 _zero = _mm256_set1_ps(0.f);
        __m256 _one = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero);
            _ans = _mm256_min_ps(_ans, _one);
            _mm256_storeu_ps(ptr, _ans);

            ptr += 8;
        }
#endif
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ++ptr;
        }
    }

    return 0;
}